

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::tableOther(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *this_01;
  uint uVar1;
  bool bVar2;
  int iVar3;
  NoViableAltException *pNVar4;
  RefAST RVar5;
  RefCount<AST> *this_02;
  RefAST tmp61_AST;
  RefAST tmp63_AST;
  RefAST tmp62_AST;
  RefAST tableOther_AST;
  ASTPair currentAST;
  RefAST tmp60_AST;
  undefined1 local_b8 [16];
  ASTFactory local_a8;
  ASTPair local_98;
  RefCount<Token> local_88;
  ASTFactory local_80;
  RefCount<Token> local_70;
  RefCount<Token> local_68;
  RefCount<AST> local_60;
  RefAST local_58;
  RefToken local_50;
  RefToken local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_a8.nodeFactory = (factory_type)nullAST;
  local_98.root.ref = (Ref *)0x0;
  local_98.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_a8.nodeFactory = (factory_type)0x0;
  }
  else {
    uVar1 = (nullAST.ref)->count;
    (nullAST.ref)->count = uVar1 + 1;
    ((Ref *)local_a8.nodeFactory)->count = uVar1 + 2;
  }
  local_60.ref = (Ref *)local_a8.nodeFactory;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
  this_01 = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)local_b8,(RefToken *)this_01);
  RefCount<AST>::operator=(&local_60,(RefCount<AST> *)local_b8);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_b8);
  RefCount<Token>::~RefCount(&local_68);
  Parser::match((Parser *)this,6);
  local_b8._0_8_ = nullAST;
  if (nullAST.ref == (Ref *)0x0) {
    local_b8._0_8_ = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70,this,1);
  ASTFactory::create(&local_a8,(RefToken *)this_01);
  RefCount<AST>::operator=((RefCount<AST> *)local_b8,(RefCount<AST> *)&local_a8);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_a8);
  RefCount<Token>::~RefCount(&local_70);
  if ((Ref *)local_b8._0_8_ == (Ref *)0x0) {
    local_38.ref = (Ref *)0x0;
  }
  else {
    *(uint *)(local_b8._0_8_ + 8) = *(uint *)(local_b8._0_8_ + 8) + 1;
    local_38.ref = (Ref *)local_b8._0_8_;
  }
  ASTFactory::addASTChild(this_01,&local_98,&local_38);
  RefCount<AST>::~RefCount(&local_38);
  Parser::match((Parser *)this,0xd);
  local_a8._vptr_ASTFactory = (_func_int **)nullAST;
  if (nullAST.ref == (Ref *)0x0) {
    local_a8._vptr_ASTFactory = (_func_int **)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80.nodeFactory,this,1);
  ASTFactory::create((ASTFactory *)(local_b8 + 8),(RefToken *)this_01);
  RefCount<AST>::operator=((RefCount<AST> *)&local_a8,(RefCount<AST> *)(local_b8 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_b8 + 8));
  RefCount<Token>::~RefCount((RefCount<Token> *)&local_80.nodeFactory);
  Parser::match((Parser *)this,7);
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 0xb) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    if (iVar3 != 0xc) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar3 != 0xd) goto LAB_0018db83;
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    if (3 < iVar3) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      if (iVar3 < 0x72) {
        directives(this);
        local_40.ref = this_00->ref;
        if (local_40.ref == (Ref *)0x0) {
          local_40.ref = (Ref *)0x0;
        }
        else {
          (local_40.ref)->count = (local_40.ref)->count + 1;
        }
        ASTFactory::addASTChild(this_01,&local_98,&local_40);
        RefCount<AST>::~RefCount(&local_40);
        goto LAB_0018dbf9;
      }
    }
  }
LAB_0018db83:
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (3 < iVar3) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 < 0x72) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      bVar2 = BitSet::member(&_tokenSet_4,iVar3);
      if (bVar2) {
        iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
        bVar2 = BitSet::member(&_tokenSet_4,iVar3);
        if (bVar2) {
LAB_0018dbf9:
          iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
          if (iVar3 == 8) {
            iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
            if (3 < iVar3) {
              iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
              if (iVar3 < 0x72) {
                iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
                bVar2 = BitSet::member(&_tokenSet_4,iVar3);
                RVar5 = nullAST;
                if (bVar2) {
                  if (nullAST.ref == (Ref *)0x0) {
                    RVar5.ref = (Ref *)0x0;
                  }
                  else {
                    (nullAST.ref)->count = (nullAST.ref)->count + 1;
                  }
                  local_b8._8_8_ = RVar5.ref;
                  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
                  ASTFactory::create(&local_80,(RefToken *)this_01);
                  RefCount<AST>::operator=
                            ((RefCount<AST> *)(local_b8 + 8),(RefCount<AST> *)&local_80);
                  RefCount<AST>::~RefCount((RefCount<AST> *)&local_80);
                  RefCount<Token>::~RefCount(&local_88);
                  Parser::match((Parser *)this,8);
                  this_02 = (RefCount<AST> *)(local_b8 + 8);
                  while( true ) {
                    RefCount<AST>::~RefCount(this_02);
LAB_0018df31:
                    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
                    bVar2 = BitSet::member(&_tokenSet_13,iVar3);
                    if (!bVar2) break;
                    otherEntry(this);
                    local_58.ref = this_00->ref;
                    if (local_58.ref == (Ref *)0x0) {
                      local_58.ref = (Ref *)0x0;
                    }
                    else {
                      (local_58.ref)->count = (local_58.ref)->count + 1;
                    }
                    ASTFactory::addASTChild(this_01,&local_98,&local_58);
                    this_02 = &local_58;
                  }
                  RefCount<AST>::operator=((RefCount<AST> *)&local_a8.nodeFactory,&local_98.root);
                  RefCount<AST>::~RefCount((RefCount<AST> *)&local_a8);
                  RefCount<AST>::~RefCount((RefCount<AST> *)local_b8);
                  RefCount<AST>::~RefCount(&local_60);
                  RefCount<AST>::operator=(this_00,(RefCount<AST> *)&local_a8.nodeFactory);
                  RefCount<AST>::~RefCount((RefCount<AST> *)&local_a8.nodeFactory);
                  RefCount<AST>::~RefCount(&local_98.child);
                  RefCount<AST>::~RefCount(&local_98.root);
                  return;
                }
              }
            }
          }
          iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
          if (3 < iVar3) {
            iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
            if (iVar3 < 0x72) {
              iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
              bVar2 = BitSet::member(&_tokenSet_4,iVar3);
              if (bVar2) {
                iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
                bVar2 = BitSet::member(&_tokenSet_4,iVar3);
                if (bVar2) goto LAB_0018df31;
              }
            }
          }
          pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
          NoViableAltException::NoViableAltException(pNVar4,&local_50);
          __cxa_throw(pNVar4,&NoViableAltException::typeinfo,
                      NoViableAltException::~NoViableAltException);
        }
      }
    }
  }
  pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
  NoViableAltException::NoViableAltException(pNVar4,&local_48);
  __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::tableOther() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST tableOther_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp60_AST = nullAST;
		tmp60_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		RefAST tmp61_AST = nullAST;
		tmp61_AST = astFactory.create(LT(1));
		astFactory.addASTChild(currentAST, tmp61_AST);
		match(IDENT);
		RefAST tmp62_AST = nullAST;
		tmp62_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		{
		if ((LA(1)==OP_LBRACE) && (LA(2)==OP_RBRACE||LA(2)==IDENT) && ((LA(3) >= OP_EQ && LA(3) <= AT_IDENT))) {
			directives();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if (((LA(1) >= OP_EQ && LA(1) <= AT_IDENT)) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		{
		if ((LA(1)==OP_SEMI) && ((LA(2) >= OP_EQ && LA(2) <= AT_IDENT)) && (_tokenSet_4.member(LA(3)))) {
			RefAST tmp63_AST = nullAST;
			tmp63_AST = astFactory.create(LT(1));
			match(OP_SEMI);
		}
		else if (((LA(1) >= OP_EQ && LA(1) <= AT_IDENT)) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		{
		do {
			if ((_tokenSet_13.member(LA(1)))) {
				otherEntry();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else {
				goto _loop341;
			}
			
		} while (true);
		_loop341:;
		}
		tableOther_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_11);
	}
	returnAST = tableOther_AST;
}